

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

void __thiscall
Js::FunctionProxy::SetLocalFunctionId(FunctionProxy *this,LocalFunctionId functionId)

{
  code *pcVar1;
  bool bVar2;
  FunctionInfo *pFVar3;
  undefined4 *puVar4;
  FunctionProxy *pFVar5;
  LocalFunctionId functionId_local;
  FunctionProxy *this_local;
  
  pFVar3 = GetFunctionInfo(this);
  if (pFVar3 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c7,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pFVar3 = GetFunctionInfo(this);
  pFVar5 = FunctionInfo::GetFunctionProxy(pFVar3);
  if (pFVar5 != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c8,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pFVar3 = GetFunctionInfo(this);
  FunctionInfo::SetLocalFunctionId(pFVar3,functionId);
  return;
}

Assistant:

inline void FunctionProxy::SetLocalFunctionId(LocalFunctionId functionId)
    {
        Assert(GetFunctionInfo());
        Assert(GetFunctionInfo()->GetFunctionProxy() == this);
        return GetFunctionInfo()->SetLocalFunctionId(functionId);
    }